

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O1

IterateResult __thiscall gl4cts::DirectStateAccess::Queries::ErrorsTest::iterate(ErrorsTest *this)

{
  ostringstream *this_00;
  PFNGLGETQUERYBUFFEROBJECT p_Var1;
  PFNGLGETQUERYBUFFEROBJECT p_Var2;
  PFNGLGETQUERYBUFFEROBJECT p_Var3;
  PFNGLGETQUERYBUFFEROBJECT p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  ContextType ctxType;
  undefined4 extraout_var;
  undefined4 *puVar14;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar13;
  
  iVar12 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar12);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar5 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar6 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar5) || (bVar6)) {
    p_Var1 = *(PFNGLGETQUERYBUFFEROBJECT *)(lVar13 + 0x9e8);
    this->m_pGetQueryBufferObjectiv = p_Var1;
    p_Var2 = *(PFNGLGETQUERYBUFFEROBJECT *)(lVar13 + 0x9f8);
    this->m_pGetQueryBufferObjectuiv = p_Var2;
    p_Var3 = *(PFNGLGETQUERYBUFFEROBJECT *)(lVar13 + 0x9e0);
    this->m_pGetQueryBufferObjecti64v = p_Var3;
    p_Var4 = *(PFNGLGETQUERYBUFFEROBJECT *)(lVar13 + 0x9f0);
    this->m_pGetQueryBufferObjectui64v = p_Var4;
    if ((p_Var1 == (PFNGLGETQUERYBUFFEROBJECT)0x0) ||
       (((p_Var2 == (PFNGLGETQUERYBUFFEROBJECT)0x0 || (p_Var3 == (PFNGLGETQUERYBUFFEROBJECT)0x0)) ||
        (p_Var4 == (PFNGLGETQUERYBUFFEROBJECT)0x0)))) {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,
                 "Test could not get the pointers for glGetQueryBufferObject* functions.",0x46);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      puVar14 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar14 = 0;
      __cxa_throw(puVar14,&int::typeinfo,0);
    }
    bVar5 = testNegativeNumberOfObjects(this);
    bVar6 = testInvalidTarget(this);
    bVar7 = testInvalidQueryName(this);
    bVar8 = testInvalidBufferName(this);
    bVar9 = testInvalidParameterName(this);
    bVar10 = testBufferOverflow(this);
    bVar11 = testBufferNegativeOffset(this);
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (((bVar9 && bVar10) && bVar11) && ((bVar7 && bVar8) && (bVar5 && bVar6))) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Getting function pointers. */
	m_pGetQueryBufferObjectiv	= (PFNGLGETQUERYBUFFEROBJECT)gl.getQueryBufferObjectiv;
	m_pGetQueryBufferObjectuiv   = (PFNGLGETQUERYBUFFEROBJECT)gl.getQueryBufferObjectuiv;
	m_pGetQueryBufferObjecti64v  = (PFNGLGETQUERYBUFFEROBJECT)gl.getQueryBufferObjecti64v;
	m_pGetQueryBufferObjectui64v = (PFNGLGETQUERYBUFFEROBJECT)gl.getQueryBufferObjectui64v;

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		if ((DE_NULL == m_pGetQueryBufferObjectiv) || (DE_NULL == m_pGetQueryBufferObjectuiv) ||
			(DE_NULL == m_pGetQueryBufferObjecti64v) || (DE_NULL == m_pGetQueryBufferObjectui64v))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Test could not get the pointers for glGetQueryBufferObject* functions."
				<< tcu::TestLog::EndMessage;

			throw 0;
		}

		is_ok &= testNegativeNumberOfObjects();
		is_ok &= testInvalidTarget();
		is_ok &= testInvalidQueryName();
		is_ok &= testInvalidBufferName();
		is_ok &= testInvalidParameterName();
		is_ok &= testBufferOverflow();
		is_ok &= testBufferNegativeOffset();
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}